

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O2

bool __thiscall
ON_PolynomialSurface::Create(ON_PolynomialSurface *this,int dim,bool is_rat,int order0,int order1)

{
  int iVar1;
  undefined3 in_register_00000011;
  int iVar2;
  
  iVar1 = 0;
  if (0 < dim) {
    iVar1 = dim;
  }
  this->m_dim = iVar1;
  iVar1 = 0;
  if (0 < order0) {
    iVar1 = order0;
  }
  this->m_is_rat = CONCAT31(in_register_00000011,is_rat);
  iVar2 = 0;
  if (0 < order1) {
    iVar2 = order1;
  }
  this->m_order[0] = iVar1;
  this->m_order[1] = iVar2;
  ON_SimpleArray<ON_4dPoint>::SetCapacity
            (&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>,(ulong)(uint)(iVar2 * iVar1));
  if ((0 < this->m_order[0]) && (0 < this->m_order[1])) {
    ON_SimpleArray<ON_4dPoint>::Zero(&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>);
    ((this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a)->w = 1.0;
  }
  return (0 < dim && 0 < order0) && 0 < order1;
}

Assistant:

bool ON_PolynomialSurface::Create( int dim, bool is_rat, int order0, int order1 )
{
  bool rc = true;
  if ( dim > 0 ) m_dim = dim; else {m_dim = 0; rc = false;};
  m_is_rat = is_rat?1:0;
  if ( order0 > 0 ) m_order[0] = order0; else { m_order[0] = 0; rc = false;}
  if ( order1 > 0 ) m_order[1] = order1; else { m_order[1] = 0; rc = false;}
  m_cv.SetCapacity( m_order[0]*m_order[1] );
  if ( m_order[0] > 0 && m_order[1] > 0 ) {
    m_cv.Zero();
    m_cv[0].w = 1.0;
  }
  return rc;
}